

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# humain.cpp
# Opt level: O3

void free(void *__ptr)

{
  hu_recursion_checker recursion_checker;
  hu_recursion_checker local_9;
  
  if (hu_bypass) {
    __libc_free(__ptr);
  }
  else {
    hu_recursion_checker::hu_recursion_checker(&local_9);
    if (hu_callcount < 2) {
      if (hu_enable_humalloc == true) {
        hu_free((void *)0x106f11);
      }
      else {
        __libc_free(__ptr);
      }
      log_event(2,__ptr,0);
    }
    else {
      __libc_free(__ptr);
    }
    hu_callcount = hu_callcount + -1;
    if (hu_recursive_mutex != (recursive_mutex *)0x0) {
      pthread_mutex_unlock((pthread_mutex_t *)hu_recursive_mutex);
    }
  }
  return;
}

Assistant:

void free(void* ptr)
{
  if (hu_bypass) return __libc_free(ptr);

  hu_recursion_checker recursion_checker;
  if (recursion_checker.is_recursive_call()) return __libc_free(ptr);

  hu_enable_humalloc ? hu_free(ptr) : __libc_free(ptr);
  log_event(EVENT_FREE, ptr, 0);
}